

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O0

int lws_ssl_close(lws *wsi)

{
  int __fd;
  lws_sockfd_type n;
  lws *wsi_local;
  
  if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
    wsi_local._4_4_ = 0;
  }
  else {
    if ((wsi->vhost->tls).ssl_info_event_mask != 0) {
      SSL_set_info_callback((SSL *)(wsi->tls).ssl,(cb *)0x0);
    }
    __fd = SSL_get_fd((SSL *)(wsi->tls).ssl);
    if ((*(ulong *)&wsi->field_0x2dc >> 0xc & 1) == 0) {
      SSL_shutdown((SSL *)(wsi->tls).ssl);
    }
    close(__fd);
    SSL_free((SSL *)(wsi->tls).ssl);
    (wsi->tls).ssl = (lws_tls_conn *)0x0;
    lws_tls_restrict_return(wsi->context);
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_ssl_close(struct lws *wsi)
{
	lws_sockfd_type n;

	if (!wsi->tls.ssl)
		return 0; /* not handled */

#if defined (LWS_HAVE_SSL_SET_INFO_CALLBACK)
	/* kill ssl callbacks, because we will remove the fd from the
	 * table linking it to the wsi
	 */
	if (wsi->vhost->tls.ssl_info_event_mask)
		SSL_set_info_callback(wsi->tls.ssl, NULL);
#endif

	n = SSL_get_fd(wsi->tls.ssl);
	if (!wsi->socket_is_permanently_unusable)
		SSL_shutdown(wsi->tls.ssl);
	compatible_close(n);
	SSL_free(wsi->tls.ssl);
	wsi->tls.ssl = NULL;

	lws_tls_restrict_return(wsi->context);

	// lwsl_notice("%s: ssl restr %d, simul %d\n", __func__,
	//		wsi->context->simultaneous_ssl_restriction,
	//		wsi->context->simultaneous_ssl);

	return 1; /* handled */
}